

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O0

void P_CopySlopes(void)

{
  int iVar1;
  sector_t_conflict *local_20;
  uint local_10;
  int local_c;
  int s;
  int i;
  
  for (local_c = 0; local_c < numlines; local_c = local_c + 1) {
    if (lines[local_c].special == 0x76) {
      lines[local_c].special = 0;
      local_10 = 0;
      while( true ) {
        iVar1 = 2;
        if (lines[local_c].backsector != (sector_t_conflict *)0x0) {
          iVar1 = 4;
        }
        if (iVar1 <= (int)local_10) break;
        if (lines[local_c].args[(int)local_10] != 0) {
          if ((local_10 & 2) == 0) {
            local_20 = lines[local_c].frontsector;
          }
          else {
            local_20 = lines[local_c].backsector;
          }
          P_CopyPlane(lines[local_c].args[(int)local_10],local_20,(local_10 & 1) != 0);
        }
        local_10 = local_10 + 1;
      }
      if (lines[local_c].backsector != (sector_t_conflict *)0x0) {
        if ((lines[local_c].args[4] & 3U) == 1) {
          secplane_t::operator=
                    (&(lines[local_c].backsector)->floorplane,
                     &(lines[local_c].frontsector)->floorplane);
        }
        else if ((lines[local_c].args[4] & 3U) == 2) {
          secplane_t::operator=
                    (&(lines[local_c].frontsector)->floorplane,
                     &(lines[local_c].backsector)->floorplane);
        }
        if ((lines[local_c].args[4] & 0xcU) == 4) {
          secplane_t::operator=
                    (&(lines[local_c].backsector)->ceilingplane,
                     &(lines[local_c].frontsector)->ceilingplane);
        }
        else if ((lines[local_c].args[4] & 0xcU) == 8) {
          secplane_t::operator=
                    (&(lines[local_c].frontsector)->ceilingplane,
                     &(lines[local_c].backsector)->ceilingplane);
        }
      }
    }
  }
  return;
}

Assistant:

void P_CopySlopes()
{
	for (int i = 0; i < numlines; i++)
	{
		if (lines[i].special == Plane_Copy)
		{
			// The args are used for the tags of sectors to copy:
			// args[0]: front floor
			// args[1]: front ceiling
			// args[2]: back floor
			// args[3]: back ceiling
			// args[4]: copy slopes from one side of the line to the other.
			lines[i].special = 0;
			for (int s = 0; s < (lines[i].backsector ? 4 : 2); s++)
			{
				if (lines[i].args[s])
					P_CopyPlane(lines[i].args[s], 
					(s & 2 ? lines[i].backsector : lines[i].frontsector), s & 1);
			}

			if (lines[i].backsector != NULL)
			{
				if ((lines[i].args[4] & 3) == 1)
				{
					lines[i].backsector->floorplane = lines[i].frontsector->floorplane;
				}
				else if ((lines[i].args[4] & 3) == 2)
				{
					lines[i].frontsector->floorplane = lines[i].backsector->floorplane;
				}
				if ((lines[i].args[4] & 12) == 4)
				{
					lines[i].backsector->ceilingplane = lines[i].frontsector->ceilingplane;
				}
				else if ((lines[i].args[4] & 12) == 8)
				{
					lines[i].frontsector->ceilingplane = lines[i].backsector->ceilingplane;
				}
			}
		}
	}
}